

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdet.c
# Opt level: O3

double mat_det(MATRIX a)

{
  int iVar1;
  MATRIX A;
  MATRIX P;
  long lVar2;
  double dVar3;
  
  iVar1 = *(int *)(a + -1);
  A = mat_copy(a);
  P = mat_creat(iVar1,1,-1);
  iVar1 = mat_lu(A,P);
  if (iVar1 == -1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 1.0;
    if (0 < (long)*(int *)(A + -1)) {
      lVar2 = 0;
      do {
        dVar3 = dVar3 * A[(int)*P[lVar2]][lVar2];
        lVar2 = lVar2 + 1;
      } while (*(int *)(A + -1) != lVar2);
    }
    dVar3 = dVar3 * signa[iVar1 % 2];
  }
  mat_free(A);
  mat_free(P);
  return dVar3;
}

Assistant:

double mat_det( MATRIX a )
{
	MATRIX	A, P;
	int	i, j, n;
	double	result;

	n = MatRow(a);
	A = mat_copy(a);
	P = mat_creat(n, 1, UNDEFINED);

	/*
	* take a LUP-decomposition
	*/
	i = mat_lu(A, P);
	switch (i)
		{
		/*
		* case for singular matrix
		*/
		case -1:
		result = 0.0;
		break;

		/*
		* normal case: |A| = |L||U||P|
		* |L| = 1,
		* |U| = multiplication of the diagonal
		* |P| = +-1
		*/
		default:
		result = 1.0;
		for (j=0; j<MatRow(A); j++)
			{
			result *= A[(int)P[j][0]][j];
			}
		result *= signa[i%2];
		break;
		}

	mat_free(A);
	mat_free(P);
	return (result);
}